

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

Error asmjit::Logging::formatLabel
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t labelId)

{
  long lVar1;
  Error EVar2;
  ulong uVar3;
  uint in_ECX;
  long in_RDX;
  StringBuilder *in_RDI;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  LabelEntry *pe;
  uint32_t parentId;
  LabelEntry *le;
  size_t index_1;
  size_t index;
  char *in_stack_00000220;
  int in_stack_0000022c;
  char *in_stack_00000230;
  undefined8 in_stack_fffffffffffffe30;
  StringBuilder *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  uint32_t op;
  StringBuilder *in_stack_fffffffffffffe58;
  long local_1a0;
  long local_188;
  Error local_124;
  
  op = (uint32_t)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  lVar1 = *(long *)(in_RDX + 0x18);
  uVar3 = (ulong)(in_ECX - 0x100);
  if (uVar3 < *(ulong *)(lVar1 + 0x100)) {
    if (*(ulong *)(lVar1 + 0x100) <= uVar3) {
      DebugUtils::assertionFailed(in_stack_00000230,in_stack_0000022c,in_stack_00000220);
    }
    local_188 = *(long *)(*(long *)(lVar1 + 0xf8) + uVar3 * 8);
  }
  else {
    local_188 = 0;
  }
  if (local_188 == 0) {
    local_124 = StringBuilder::appendFormat(in_RDI,"InvalidLabel[Id=%u]",(ulong)in_ECX);
  }
  else if (*(int *)(local_188 + 0x30) == 0) {
    local_124 = StringBuilder::appendFormat(in_RDI,"L%u",(ulong)(in_ECX - 0x100));
  }
  else {
    if (*(int *)(local_188 + 0x14) != 0) {
      lVar1 = *(long *)(in_RDX + 0x18);
      uVar3 = (ulong)(*(int *)(local_188 + 0x14) - 0x100);
      if (uVar3 < *(ulong *)(lVar1 + 0x100)) {
        if (*(ulong *)(lVar1 + 0x100) <= uVar3) {
          DebugUtils::assertionFailed(in_stack_00000230,in_stack_0000022c,in_stack_00000220);
        }
        local_1a0 = *(long *)(*(long *)(lVar1 + 0xf8) + uVar3 * 8);
      }
      else {
        local_1a0 = 0;
      }
      if (local_1a0 == 0) {
        EVar2 = StringBuilder::appendFormat(in_RDI,"InvalidLabel[Id=%u]",(ulong)in_ECX);
      }
      else if (*(int *)(local_1a0 + 0x30) == 0) {
        EVar2 = StringBuilder::appendFormat
                          (in_RDI,"L%u",(ulong)(*(int *)(local_188 + 0x14) - 0x100));
      }
      else {
        in_stack_fffffffffffffe58 = (StringBuilder *)(local_1a0 + 0x30);
        if (*(uint *)&in_stack_fffffffffffffe58->_data < 0xc) {
          in_stack_fffffffffffffe48 = (char *)(local_1a0 + 0x34);
        }
        else {
          in_stack_fffffffffffffe48 = *(char **)(local_1a0 + 0x38);
        }
        EVar2 = StringBuilder::_opString
                          (in_stack_fffffffffffffe58,(uint32_t)((ulong)in_RDI >> 0x20),
                           in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        op = (uint32_t)((ulong)in_RDI >> 0x20);
      }
      if (EVar2 != 0) {
        return EVar2;
      }
      EVar2 = StringBuilder::_opChar
                        (in_stack_fffffffffffffe38,
                         (uint32_t)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                         (char)((ulong)in_stack_fffffffffffffe30 >> 0x18));
      if (EVar2 != 0) {
        return EVar2;
      }
    }
    local_124 = StringBuilder::_opString
                          (in_stack_fffffffffffffe58,op,in_stack_fffffffffffffe48,local_188 + 0x30);
  }
  return local_124;
}

Assistant:

Error Logging::formatLabel(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t labelId) noexcept {

  const LabelEntry* le = emitter->getCode()->getLabelEntry(labelId);
  if (ASMJIT_UNLIKELY(!le))
    return sb.appendFormat("InvalidLabel[Id=%u]", static_cast<unsigned int>(labelId));

  if (le->hasName()) {
    if (le->hasParent()) {
      uint32_t parentId = le->getParentId();
      const LabelEntry* pe = emitter->getCode()->getLabelEntry(parentId);

      if (ASMJIT_UNLIKELY(!pe))
        ASMJIT_PROPAGATE(sb.appendFormat("InvalidLabel[Id=%u]", static_cast<unsigned int>(labelId)));
      else if (ASMJIT_UNLIKELY(!pe->hasName()))
        ASMJIT_PROPAGATE(sb.appendFormat("L%u", Operand::unpackId(parentId)));
      else
        ASMJIT_PROPAGATE(sb.appendString(pe->getName()));

      ASMJIT_PROPAGATE(sb.appendChar('.'));
    }
    return sb.appendString(le->getName());
  }
  else {
    return sb.appendFormat("L%u", Operand::unpackId(labelId));
  }
}